

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.h
# Opt level: O0

void __thiscall ValidateFootprint::ValidateFootprint(ValidateFootprint *this)

{
  ValidateFootprint *this_local;
  
  Validate::Validate(&this->super_Validate);
  this->_vptr_ValidateFootprint = (_func_int **)&PTR_SetPreviousEventID_0010cd78;
  this->convertToBin_ = false;
  this->validationCheck_ = true;
  builtin_strncpy(this->eveIDName_,"Event",6);
  builtin_strncpy(this->areaperilIDName_,"Areaperil",10);
  std::vector<int,_std::allocator<int>_>::vector(&this->intensityBinIDs_);
  this->maxIntensityBin_ = 0;
  strcpy((this->super_Validate).fileDescription_,"Footprint");
  return;
}

Assistant:

ValidateFootprint() {
    strcpy(fileDescription_, "Footprint");
  }